

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O0

string * __thiscall
flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription
          (string *__return_storage_ptr__,JsonSchemaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *comment_lines)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *s;
  size_t length;
  allocator<char> local_f6;
  allocator<char> local_f5;
  undefined4 local_f4;
  undefined1 local_f0 [8];
  string description;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 local_a8 [8];
  undefined1 local_a0 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  iterator_type end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *comment_line;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator line_iterator;
  string comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *comment_lines_local;
  JsonSchemaGenerator *this_local;
  
  std::__cxx11::string::string((string *)&line_iterator);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::cbegin(comment_lines);
  while( true ) {
    comment_line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::cend(comment_lines);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&comment_line);
    if (!bVar1) break;
    start._M_current =
         (char *)__gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_48);
    uVar2 = std::__cxx11::string::begin();
    uVar3 = std::__cxx11::string::end();
    local_60 = std::
               find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(char)_1_>
                         (uVar2,uVar3);
    std::__cxx11::string::rbegin();
    std::__cxx11::string::rend();
    std::
    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(char)_2_>
              (&local_98,local_a0,local_a8);
    local_90._M_current =
         (char *)std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::base(&local_98);
    bVar1 = __gnu_cxx::operator<(&local_60,&local_90);
    if (bVar1) {
      local_b8 = local_60._M_current;
      local_c0 = local_90._M_current;
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)&line_iterator,local_60,local_90);
    }
    else {
      std::__cxx11::string::append((string *)&line_iterator);
    }
    local_c8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator+(&local_48,1);
    description.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::cend(comment_lines);
    bVar1 = __gnu_cxx::operator!=
                      (&local_c8,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&description.field_2 + 8));
    if (bVar1) {
      std::__cxx11::string::append((char *)&line_iterator);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_48);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string((string *)local_f0);
    s = (char *)std::__cxx11::string::c_str();
    length = std::__cxx11::string::length();
    bVar1 = EscapeString(s,length,(string *)local_f0,true,true);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_f0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_f5);
      std::allocator<char>::~allocator(&local_f5);
    }
    local_f4 = 1;
    std::__cxx11::string::~string((string *)local_f0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_f6);
    std::allocator<char>::~allocator(&local_f6);
    local_f4 = 1;
  }
  std::__cxx11::string::~string((string *)&line_iterator);
  return __return_storage_ptr__;
}

Assistant:

std::string PrepareDescription(
      const std::vector<std::string> &comment_lines) {
    std::string comment;
    for (auto line_iterator = comment_lines.cbegin();
         line_iterator != comment_lines.cend(); ++line_iterator) {
      const auto &comment_line = *line_iterator;

      // remove leading and trailing spaces from comment line
      const auto start = std::find_if(comment_line.begin(), comment_line.end(),
                                      [](char c) { return !isspace(c); });
      const auto end =
          std::find_if(comment_line.rbegin(), comment_line.rend(), [](char c) {
            return !isspace(c);
          }).base();
      if (start < end) {
        comment.append(start, end);
      } else {
        comment.append(comment_line);
      }

      if (line_iterator + 1 != comment_lines.cend()) comment.append("\n");
    }
    if (!comment.empty()) {
      std::string description;
      if (EscapeString(comment.c_str(), comment.length(), &description, true,
                       true)) {
        return description;
      }
      return "";
    }
    return "";
  }